

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O0

CompilationOptions * __thiscall slang::Bag::getOrDefault<slang::ast::CompilationOptions>(Bag *this)

{
  CompilationOptions *pCVar1;
  CompilationOptions *in_RDI;
  CompilationOptions *unaff_retaddr;
  CompilationOptions *result;
  Bag *in_stack_00000028;
  CompilationOptions *this_00;
  CompilationOptions *pCVar2;
  
  this_00 = in_RDI;
  pCVar2 = in_RDI;
  pCVar1 = get<slang::ast::CompilationOptions>(in_stack_00000028);
  if (pCVar1 == (CompilationOptions *)0x0) {
    memset(in_RDI,0,0xa8);
    ast::CompilationOptions::CompilationOptions(this_00);
  }
  else {
    ast::CompilationOptions::CompilationOptions(unaff_retaddr,pCVar2);
  }
  return this_00;
}

Assistant:

T getOrDefault() const {
        const T* result = get<T>();
        if (result)
            return *result;
        return T();
    }